

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

Gia_Man_t *
Str_NtkBalance(Gia_Man_t *pGia,Str_Ntk_t *p,int nLutSize,int fUseMuxes,int fRecursive,int fOptArea,
              int fVerbose)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  uint *puVar11;
  int *piVar12;
  Vec_Int_t *pVVar13;
  Gia_Obj_t *pGVar14;
  Gia_Man_t *pGVar15;
  uint uVar16;
  Str_Obj_t *pSVar17;
  ulong uVar18;
  int iVar19;
  Str_Obj_t *pObj;
  float fVar20;
  uint local_58;
  
  if (0xf < nLutSize) {
    __assert_fail("nLutSize < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x50e,
                  "Gia_Man_t *Str_NtkBalance(Gia_Man_t *, Str_Ntk_t *, int, int, int, int, int)");
  }
  if (pGia->pMuxes != (uint *)0x0) {
    __assert_fail("pGia->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x50f,
                  "Gia_Man_t *Str_NtkBalance(Gia_Man_t *, Str_Ntk_t *, int, int, int, int, int)");
  }
  p_00 = Gia_ManStart(pGia->nObjs);
  pcVar4 = pGia->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar4);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar4);
  }
  p_00->pName = pcVar10;
  pcVar4 = pGia->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar4);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar4);
  }
  p_00->pSpec = pcVar10;
  uVar7 = p_00->nObjsAlloc;
  puVar11 = (uint *)calloc((long)(int)uVar7,4);
  p_00->pMuxes = puVar11;
  if ((p_00->vCopies).nCap < (int)uVar7) {
    piVar12 = (p_00->vCopies).pArray;
    sVar9 = (long)(int)uVar7 << 2;
    if (piVar12 == (int *)0x0) {
      piVar12 = (int *)malloc(sVar9);
    }
    else {
      piVar12 = (int *)realloc(piVar12,sVar9);
    }
    (p_00->vCopies).pArray = piVar12;
    if (piVar12 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p_00->vCopies).nCap = uVar7;
  }
  if (0 < (int)uVar7) {
    memset((p_00->vCopies).pArray,0xff,(ulong)uVar7 * 4);
  }
  (p_00->vCopies).nSize = uVar7;
  if (p_00->vSuper == (Vec_Int_t *)0x0) {
    pVVar13 = (Vec_Int_t *)malloc(0x10);
    pVVar13->nCap = 1000;
    pVVar13->nSize = 0;
    piVar12 = (int *)malloc(4000);
    pVVar13->pArray = piVar12;
    p_00->vSuper = pVVar13;
  }
  if (p_00->vStore == (Vec_Int_t *)0x0) {
    pVVar13 = (Vec_Int_t *)malloc(0x10);
    pVVar13->nCap = 1000;
    pVVar13->nSize = 0;
    piVar12 = (int *)malloc(4000);
    pVVar13->pArray = piVar12;
    p_00->vStore = pVVar13;
  }
  iVar8 = p_00->nObjsAlloc;
  iVar19 = iVar8 * 2;
  pVVar13 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar19 - 1U) {
    iVar6 = iVar19;
  }
  pVVar13->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar13->pArray = (int *)0x0;
    pVVar13->nSize = iVar19;
  }
  else {
    piVar12 = (int *)malloc((long)iVar6 << 2);
    pVVar13->pArray = piVar12;
    pVVar13->nSize = iVar19;
    if (piVar12 != (int *)0x0) {
      memset(piVar12,0,(long)iVar8 << 3);
    }
  }
  Gia_ManHashStart(p_00);
  if ((Tim_Man_t *)pGia->pManTime != (Tim_Man_t *)0x0) {
    Tim_ManInitPiArrivalAll((Tim_Man_t *)pGia->pManTime,17.0);
    Tim_ManIncrementTravId((Tim_Man_t *)pGia->pManTime);
  }
  uVar7 = p->nObjs;
  if ((int)uVar7 < 1) {
    uVar18 = 0;
  }
  else {
    pSVar17 = p->pObjs;
    local_58 = 0;
    pObj = pSVar17;
    do {
      switch(*(uint *)pObj & 0xf) {
      case 1:
        pObj->iCopy = 0;
        if (pVVar13->nSize < 1) {
LAB_007e6acd:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *pVVar13->pArray = 0x11;
        break;
      case 2:
        pGVar14 = Gia_ManAppendObj(p_00);
        uVar18 = *(ulong *)pGVar14;
        *(ulong *)pGVar14 = uVar18 | 0x9fffffff;
        *(ulong *)pGVar14 =
             uVar18 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar5 = p_00->pObjs;
        if ((pGVar14 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar14)) {
LAB_007e6a8f:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar14 - (long)pGVar5) >> 2) * -0x55555555);
        pGVar5 = p_00->pObjs;
        if ((pGVar14 < pGVar5) || (iVar8 = p_00->nObjs, pGVar5 + iVar8 <= pGVar14))
        goto LAB_007e6a8f;
        iVar19 = (int)((long)pGVar14 - (long)pGVar5 >> 2);
        uVar16 = iVar19 * -0x55555555;
        uVar7 = iVar19 * 0x55555556;
        pObj->iCopy = uVar7;
        if ((Tim_Man_t *)pGia->pManTime == (Tim_Man_t *)0x0) {
          iVar8 = 0x11;
        }
        else {
          if ((int)uVar7 < 0) goto LAB_007e6a51;
          if (iVar8 <= (int)(uVar16 & 0x7fffffff)) {
LAB_007e6aec:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (-1 < (int)*(undefined8 *)(pGVar5 + (uVar16 & 0x7fffffff))) {
LAB_007e6b0b:
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          fVar20 = Tim_ManGetCiArrival((Tim_Man_t *)pGia->pManTime,
                                       (uint)((ulong)*(undefined8 *)(pGVar5 + (uVar16 & 0x7fffffff))
                                             >> 0x20) & 0x1fffffff);
          iVar8 = (int)fVar20;
          uVar7 = pObj->iCopy;
        }
        if ((int)uVar7 < 0) goto LAB_007e6a51;
        if (pVVar13->nSize <= (int)(uVar7 >> 1)) goto LAB_007e6acd;
        pVVar13->pArray[uVar7 >> 1] = iVar8;
        break;
      case 3:
      case 4:
        Str_NtkBalanceMulti(p_00,p,pObj,pVVar13,nLutSize);
        break;
      case 5:
        if (fUseMuxes != 0) {
          uVar16 = pObj->iTop;
          uVar18 = (ulong)uVar16;
          if (-1 < (int)uVar16) {
            if (uVar18 == 0) {
              iVar8 = 0;
              iVar19 = 0;
            }
            else {
              if ((int)uVar7 <= (int)uVar16) goto LAB_007e6a70;
              if ((int)uVar7 <= pSVar17[uVar18].iTop) goto LAB_007e6a70;
              iVar19 = (int)((long)pSVar17 + (uVar18 * 0x10 - (long)pObj) >> 4) + 1;
              iVar8 = (int)((((long)pSVar17 + ((long)pSVar17[uVar18].iTop * 0x10 - (long)pObj) >> 4)
                            + 1) / (long)iVar19);
            }
            if (iVar19 * iVar8 < 2) {
              __assert_fail("nGroups * nMuxes >= 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                            ,0x532,
                            "Gia_Man_t *Str_NtkBalance(Gia_Man_t *, Str_Ntk_t *, int, int, int, int, int)"
                           );
            }
            Str_NtkBalanceMux(p_00,p,pObj,pVVar13,nLutSize,iVar8,iVar19,fRecursive,fOptArea,fVerbose
                             );
            pObj = pObj + (iVar19 * iVar8 - 1);
            break;
          }
        }
        uVar16 = pObj->iOffset;
        if ((long)(int)uVar16 < -2) {
LAB_007e6a32:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar1 = (p->vFanins).nSize;
        if ((int)uVar1 <= (int)(uVar16 + 2)) goto LAB_007e6a32;
        piVar12 = (p->vFanins).pArray;
        uVar2 = piVar12[uVar16 + 2];
        if ((int)uVar2 < 0) goto LAB_007e6a51;
        if ((int)uVar7 <= (int)(uVar2 >> 1)) {
LAB_007e6a70:
          __assert_fail("i < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                        ,0x52,"Str_Obj_t *Str_NtkObj(Str_Ntk_t *, int)");
        }
        if (pSVar17[uVar2 >> 1].iCopy < 0) {
LAB_007e6aae:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        if (uVar1 <= uVar16 + 1) goto LAB_007e6a32;
        uVar3 = piVar12[uVar16 + 1];
        if ((int)uVar3 < 0) goto LAB_007e6a51;
        if (uVar7 <= uVar3 >> 1) goto LAB_007e6a70;
        if (pSVar17[uVar3 >> 1].iCopy < 0) goto LAB_007e6aae;
        if (((int)uVar16 < 0) || (uVar1 <= uVar16)) goto LAB_007e6a32;
        uVar16 = piVar12[(int)uVar16];
        if ((int)uVar16 < 0) {
LAB_007e6a51:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (uVar7 <= uVar16 >> 1) goto LAB_007e6a70;
        if (pSVar17[uVar16 >> 1].iCopy < 0) goto LAB_007e6aae;
        uVar7 = Gia_ManHashMuxReal(p_00,pSVar17[uVar2 >> 1].iCopy ^ uVar2 & 1,
                                   pSVar17[uVar3 >> 1].iCopy ^ uVar3 & 1,
                                   pSVar17[uVar16 >> 1].iCopy ^ uVar16 & 1);
        pObj->iCopy = uVar7;
        if ((int)uVar7 < 0) goto LAB_007e6a51;
        Str_ObjDelay(p_00,uVar7 >> 1,nLutSize,pVVar13);
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0x548,
                      "Gia_Man_t *Str_NtkBalance(Gia_Man_t *, Str_Ntk_t *, int, int, int, int, int)"
                     );
      case 7:
        iVar8 = pObj->iOffset;
        if (((long)iVar8 < 0) || ((p->vFanins).nSize <= iVar8)) goto LAB_007e6a32;
        uVar16 = (p->vFanins).pArray[iVar8];
        if ((int)uVar16 < 0) goto LAB_007e6a51;
        if ((int)uVar7 <= (int)(uVar16 >> 1)) goto LAB_007e6a70;
        if (pSVar17[uVar16 >> 1].iCopy < 0) goto LAB_007e6aae;
        uVar7 = Gia_ManAppendCo(p_00,pSVar17[uVar16 >> 1].iCopy ^ uVar16 & 1);
        pObj->iCopy = uVar7;
        iVar8 = pObj->iOffset;
        if (((long)iVar8 < 0) || ((p->vFanins).nSize <= iVar8)) goto LAB_007e6a32;
        uVar16 = (p->vFanins).pArray[iVar8];
        if ((int)uVar16 < 0) goto LAB_007e6a51;
        uVar16 = uVar16 >> 1;
        if (p->nObjs <= (int)uVar16) goto LAB_007e6a70;
        uVar16 = p->pObjs[uVar16].iCopy;
        if ((int)uVar16 < 0) goto LAB_007e6aae;
        uVar16 = uVar16 >> 1;
        if (pVVar13->nSize <= (int)uVar16) goto LAB_007e6a32;
        uVar16 = pVVar13->pArray[uVar16];
        if ((int)local_58 <= (int)uVar16) {
          local_58 = uVar16;
        }
        if ((Tim_Man_t *)pGia->pManTime != (Tim_Man_t *)0x0) {
          if ((int)uVar7 < 0) goto LAB_007e6a51;
          if (p_00->nObjs <= (int)(uVar7 >> 1)) goto LAB_007e6aec;
          if (-1 < (int)*(undefined8 *)(p_00->pObjs + (uVar7 >> 1))) goto LAB_007e6b0b;
          Tim_ManSetCoArrival((Tim_Man_t *)pGia->pManTime,
                              (uint)((ulong)*(undefined8 *)(p_00->pObjs + (uVar7 >> 1)) >> 0x20) &
                              0x1fffffff,(float)(int)uVar16);
        }
      }
      pObj = pObj + 1;
      pSVar17 = p->pObjs;
      uVar7 = p->nObjs;
    } while ((int)((ulong)((long)pObj - (long)pSVar17) >> 4) < (int)uVar7);
    uVar18 = (ulong)(local_58 >> 4);
  }
  if (fVerbose != 0) {
    printf("Max delay = %d.  Old objs = %d.  New objs = %d.\n",uVar18,(ulong)(uint)pGia->nObjs,
           (ulong)(uint)p_00->nObjs);
  }
  if (pVVar13->pArray != (int *)0x0) {
    free(pVVar13->pArray);
  }
  free(pVVar13);
  piVar12 = (p_00->vCopies).pArray;
  if (piVar12 != (int *)0x0) {
    free(piVar12);
    (p_00->vCopies).pArray = (int *)0x0;
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,pGia->nRegs);
  pGVar15 = Gia_ManDupNoMuxes(p_00,0);
  Gia_ManStop(p_00);
  return pGVar15;
}

Assistant:

Gia_Man_t * Str_NtkBalance( Gia_Man_t * pGia, Str_Ntk_t * p, int nLutSize, int fUseMuxes, int fRecursive, int fOptArea, int fVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Vec_Int_t * vDelay;
    Str_Obj_t * pObj; 
    int nGroups, nMuxes, CioId;
    int arrTime, Delay = 0;
    assert( nLutSize < 16 );
    assert( pGia->pMuxes == NULL );
    pNew = Gia_ManStart( Gia_ManObjNum(pGia) );
    pNew->pName = Abc_UtilStrsav( pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( pGia->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    Vec_IntFill( &pNew->vCopies, pNew->nObjsAlloc, -1 );
    if ( pNew->vSuper == NULL )
        pNew->vSuper = Vec_IntAlloc( 1000 );
    if ( pNew->vStore == NULL )
        pNew->vStore = Vec_IntAlloc( 1000 );
    vDelay = Vec_IntStart( 2*pNew->nObjsAlloc );
    Gia_ManHashStart( pNew );
    if ( pGia->pManTime != NULL ) // Tim_Man with unit delay 16
    {
        Tim_ManInitPiArrivalAll( (Tim_Man_t *)pGia->pManTime, 17 );
        Tim_ManIncrementTravId( (Tim_Man_t *)pGia->pManTime );
    }
    Str_NtkManForEachObj( p, pObj )
    {
        if ( pObj->Type == STR_PI )
        {
            pObj->iCopy = Gia_ManAppendCi( pNew );
            arrTime = 17;
            if ( pGia->pManTime != NULL )
            {
                CioId = Gia_ObjCioId( Gia_ManObj(pNew, Abc_Lit2Var(pObj->iCopy)) );
                arrTime = (int)Tim_ManGetCiArrival( (Tim_Man_t *)pGia->pManTime, CioId );
            }
            Vec_IntWriteEntry( vDelay, Abc_Lit2Var(pObj->iCopy), arrTime );
        }
        else if ( pObj->Type == STR_AND || pObj->Type == STR_XOR )
            Str_NtkBalanceMulti( pNew, p, pObj, vDelay, nLutSize );
        else if ( pObj->Type == STR_MUX && pObj->iTop >= 0 && fUseMuxes )
        {
            Str_ObjReadGroup( p, pObj, &nGroups, &nMuxes );
            assert( nGroups * nMuxes >= 2 );
            Str_NtkBalanceMux( pNew, p, pObj, vDelay, nLutSize, nGroups, nMuxes, fRecursive, fOptArea, fVerbose );
            pObj += nGroups * nMuxes - 1;
        }
        else if ( pObj->Type == STR_MUX )
        {
            pObj->iCopy = Gia_ManHashMuxReal( pNew, Str_ObjFaninCopy(p, pObj, 2), Str_ObjFaninCopy(p, pObj, 1), Str_ObjFaninCopy(p, pObj, 0) );
            Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
        }
        else if ( pObj->Type == STR_PO )
        {
            pObj->iCopy = Gia_ManAppendCo( pNew, Str_ObjFaninCopy(p, pObj, 0) );
            arrTime = Vec_IntEntry(vDelay, Abc_Lit2Var(Str_ObjFaninCopy(p, pObj, 0)) );
            Delay = Abc_MaxInt( Delay, arrTime );
            if ( pGia->pManTime != NULL )
            {
                CioId = Gia_ObjCioId( Gia_ManObj(pNew, Abc_Lit2Var(pObj->iCopy)) );
                Tim_ManSetCoArrival( (Tim_Man_t *)pGia->pManTime, CioId, (float)arrTime );
            }
        }
        else if ( pObj->Type == STR_CONST0 )
            pObj->iCopy = 0, Vec_IntWriteEntry(vDelay, 0, 17);
        else assert( 0 );
    }
    if ( fVerbose )
        printf( "Max delay = %d.  Old objs = %d.  New objs = %d.\n", Delay >> 4, Gia_ManObjNum(pGia), Gia_ManObjNum(pNew) );
    Vec_IntFree( vDelay );
    ABC_FREE( pNew->vCopies.pArray );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(pGia) );
    pNew = Gia_ManDupNoMuxes( pTemp = pNew, 0 );
    Gia_ManStop( pTemp );
//    if ( pGia->pManTime != NULL )
//        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)pGia->pManTime, 0 );
    return pNew;
}